

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-affinity.c
# Opt level: O2

int run_test_thread_affinity(void)

{
  char *pcVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  char *__s;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  ulong uVar11;
  size_t __n;
  bool bVar12;
  int64_t eval_b;
  int64_t eval_a;
  uv_thread_t threads [3];
  
  threads[0] = uv_thread_self();
  uVar3 = uv_cpumask_size();
  __n = (size_t)(int)uVar3;
  eval_b = 0;
  if ((long)__n < 1) {
    pcVar9 = ">";
    pcVar10 = "0";
    pcVar8 = "cpumasksize";
    uVar6 = 0x42;
    eval_a = __n;
  }
  else {
    __s = (char *)calloc((long)(int)(uVar3 * 4),1);
    if (__s == (char *)0x0) {
      pcVar8 = "cpumask";
      uVar6 = 0x45;
LAB_00194aa1:
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
              ,uVar6,pcVar8);
      abort();
    }
    iVar4 = uv_thread_getaffinity(threads,__s,__n);
    eval_b = 0;
    if ((long)iVar4 == 0) {
      if (*__s == '\0') {
        pcVar8 = "cpumask[0] && \"test must be run with cpu 0 affinity\"";
        uVar6 = 0x49;
        goto LAB_00194aa1;
      }
      uVar11 = 0xffffffffffffffff;
      do {
        lVar2 = uVar11 + 2;
        uVar11 = uVar11 + 1;
      } while (__s[lVar2] != '\0');
      memset(__s,0,(long)(int)(uVar3 * 4));
      __s[__n] = '\x01';
      __s[__n * 2] = '\x01';
      bVar12 = uVar11 != 0;
      __s[bVar12] = '\x01';
      __s[(int)((int)(__n * 3) + (uint)bVar12)] = '\x01';
      __s[__n + 2] = '\x01';
      __s[__n * 2 + 2] = '\x01';
      __s[3] = '\x01';
      __s[__n * 3 + 3] = '\x01';
      iVar4 = uv_thread_create(threads + 1,check_affinity,__s);
      eval_b = 0;
      if ((long)iVar4 == 0) {
        pcVar1 = __s + __n * 2;
        iVar4 = uv_thread_create(threads + 2,check_affinity,pcVar1);
        eval_b = 0;
        if ((long)iVar4 == 0) {
          iVar4 = uv_thread_join(threads + 1);
          eval_b = 0;
          if ((long)iVar4 == 0) {
            iVar4 = uv_thread_join(threads + 2);
            eval_b = 0;
            if ((long)iVar4 == 0) {
              if ((int)*__s == (uint)(uVar11 == 0)) {
                if ((int)__s[1] == (uint)bVar12) {
                  eval_b = 0;
                  if ((long)__s[2] == 0) {
                    if ((int)__s[3] != (uint)(2 < uVar11)) {
                      pcVar8 = "cpumask[t1first + 3] == (ncpus >= 4)";
                      uVar6 = 0x73;
                      goto LAB_00194aa1;
                    }
                    eval_a = 1;
                    eval_b = (int64_t)*pcVar1;
                    if (eval_b == 1) {
                      eval_b = 0;
                      if ((long)__s[(long)(int)(uVar3 * 2) + 1] == 0) {
                        if ((int)pcVar1[2] != (uint)(1 < uVar11)) {
                          pcVar8 = "cpumask[t2first + 2] == (ncpus >= 3)";
                          uVar6 = 0x77;
                          goto LAB_00194aa1;
                        }
                        eval_b = 0;
                        if ((long)pcVar1[3] == 0) {
                          uVar5 = uv_thread_getcpu();
                          eval_a = (int64_t)(int)uVar5;
                          eval_b = 0;
                          if (eval_a < 0) {
                            pcVar9 = ">=";
                            pcVar10 = "0";
                            pcVar8 = "c";
                            uVar6 = 0x7b;
                          }
                          else {
                            memset(__s,0,__n);
                            __s[eval_a] = '\x01';
                            iVar4 = uv_thread_setaffinity(threads,__s,0,__n);
                            eval_b = 0;
                            if ((long)iVar4 == 0) {
                              uVar11 = 0;
                              memset(__s,0,__n);
                              iVar4 = uv_thread_getaffinity(threads,__s,__n);
                              eval_b = 0;
                              if ((long)iVar4 == 0) {
                                uVar7 = (ulong)uVar3;
                                if ((int)uVar3 < 1) {
                                  uVar7 = uVar11;
                                }
                                do {
                                  if (uVar7 == uVar11) {
                                    free(__s);
                                    return 0;
                                  }
                                  if (uVar5 == uVar11) {
                                    eval_a = 1;
                                    eval_b = (int64_t)__s[uVar5];
                                    if (eval_b != 1) {
                                      pcVar9 = "==";
                                      pcVar10 = "cpumask[i]";
                                      pcVar8 = "1";
                                      uVar6 = 0x87;
                                      goto LAB_00194b0f;
                                    }
                                  }
                                  else {
                                    eval_b = 0;
                                    if ((long)__s[uVar11] != 0) {
                                      pcVar9 = "==";
                                      pcVar10 = "0";
                                      pcVar8 = "cpumask[i]";
                                      uVar6 = 0x89;
                                      eval_a = (long)__s[uVar11];
                                      goto LAB_00194b0f;
                                    }
                                  }
                                  uVar11 = uVar11 + 1;
                                } while( true );
                              }
                              pcVar9 = "==";
                              pcVar10 = "0";
                              pcVar8 = "r";
                              uVar6 = 0x84;
                              eval_a = (long)iVar4;
                            }
                            else {
                              pcVar9 = "==";
                              pcVar10 = "0";
                              pcVar8 = "r";
                              uVar6 = 0x80;
                              eval_a = (long)iVar4;
                            }
                          }
                        }
                        else {
                          pcVar9 = "==";
                          pcVar10 = "0";
                          pcVar8 = "cpumask[t2first + 3]";
                          uVar6 = 0x78;
                          eval_a = (long)pcVar1[3];
                        }
                      }
                      else {
                        pcVar9 = "==";
                        pcVar10 = "0";
                        pcVar8 = "cpumask[t2first + 1]";
                        uVar6 = 0x76;
                        eval_a = (long)__s[(long)(int)(uVar3 * 2) + 1];
                      }
                    }
                    else {
                      pcVar9 = "==";
                      pcVar10 = "cpumask[t2first + 0]";
                      pcVar8 = "1";
                      uVar6 = 0x75;
                    }
                  }
                  else {
                    pcVar9 = "==";
                    pcVar10 = "0";
                    pcVar8 = "cpumask[t1first + 2]";
                    uVar6 = 0x72;
                    eval_a = (long)__s[2];
                  }
                  goto LAB_00194b0f;
                }
                pcVar8 = "cpumask[t1first + 1] == (ncpus >= 2)";
                uVar6 = 0x71;
              }
              else {
                pcVar8 = "cpumask[t1first + 0] == (ncpus == 1)";
                uVar6 = 0x70;
              }
              goto LAB_00194aa1;
            }
            pcVar9 = "==";
            pcVar10 = "0";
            pcVar8 = "uv_thread_join(threads + 2)";
            uVar6 = 0x6e;
            eval_a = (long)iVar4;
          }
          else {
            pcVar9 = "==";
            pcVar10 = "0";
            pcVar8 = "uv_thread_join(threads + 1)";
            uVar6 = 0x6d;
            eval_a = (long)iVar4;
          }
        }
        else {
          pcVar9 = "==";
          pcVar10 = "0";
          pcVar8 = "uv_thread_create(threads + 2, check_affinity, &cpumask[t2first])";
          uVar6 = 0x6c;
          eval_a = (long)iVar4;
        }
      }
      else {
        pcVar9 = "==";
        pcVar10 = "0";
        pcVar8 = "uv_thread_create(threads + 1, check_affinity, &cpumask[t1first])";
        uVar6 = 0x69;
        eval_a = (long)iVar4;
      }
    }
    else {
      pcVar9 = "==";
      pcVar10 = "0";
      pcVar8 = "r";
      uVar6 = 0x48;
      eval_a = (long)iVar4;
    }
  }
LAB_00194b0f:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-thread-affinity.c"
          ,uVar6,pcVar8,pcVar9,pcVar10,eval_a,pcVar9,eval_b);
  abort();
}

Assistant:

TEST_IMPL(thread_affinity) {
  int t1first;
  int t1second;
  int t2first;
  int t2second;
  int cpumasksize;
  char* cpumask;
  int ncpus;
  int r;
  int c;
  int i;
  uv_thread_t threads[3];

#ifdef _WIN32
  /* uv_thread_self isn't defined for the main thread on Windows */
  threads[0] = GetCurrentThread();
#else
  threads[0] = uv_thread_self();
#endif
  cpumasksize = uv_cpumask_size();
  ASSERT_GT(cpumasksize, 0);

  cpumask = calloc(4 * cpumasksize, 1);
  ASSERT(cpumask);

  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  ASSERT(cpumask[0] && "test must be run with cpu 0 affinity");
  ncpus = 0;
  while (cpumask[++ncpus]) { }
  memset(cpumask, 0, 4 * cpumasksize);

  t1first = cpumasksize * 0;
  t1second = cpumasksize * 1;
  t2first = cpumasksize * 2;
  t2second = cpumasksize * 3;

  cpumask[t1second + 0] = 1;
  cpumask[t2first + 0] = 1;
  cpumask[t1first + (ncpus >= 2)] = 1;
  cpumask[t2second + (ncpus >= 2)] = 1;
#ifdef __linux__
  cpumask[t1second + 2] = 1;
  cpumask[t2first + 2] = 1;
  cpumask[t1first + 3] = 1;
  cpumask[t2second + 3] = 1;
#else
  if (ncpus >= 3) {
    cpumask[t1second + 2] = 1;
    cpumask[t2first + 2] = 1;
  }
  if (ncpus >= 4) {
    cpumask[t1first + 3] = 1;
    cpumask[t2second + 3] = 1;
  }
#endif

  ASSERT_OK(uv_thread_create(threads + 1,
                             check_affinity,
                             &cpumask[t1first]));
  ASSERT_OK(uv_thread_create(threads + 2,
                             check_affinity,
                             &cpumask[t2first]));
  ASSERT_OK(uv_thread_join(threads + 1));
  ASSERT_OK(uv_thread_join(threads + 2));

  ASSERT(cpumask[t1first + 0] == (ncpus == 1));
  ASSERT(cpumask[t1first + 1] == (ncpus >= 2));
  ASSERT_OK(cpumask[t1first + 2]);
  ASSERT(cpumask[t1first + 3] == (ncpus >= 4));

  ASSERT_EQ(1, cpumask[t2first + 0]);
  ASSERT_OK(cpumask[t2first + 1]);
  ASSERT(cpumask[t2first + 2] == (ncpus >= 3));
  ASSERT_OK(cpumask[t2first + 3]);

  c = uv_thread_getcpu();
  ASSERT_GE(c, 0);

  memset(cpumask, 0, cpumasksize);
  cpumask[c] = 1;
  r = uv_thread_setaffinity(&threads[0], cpumask, NULL, cpumasksize);
  ASSERT_OK(r);

  memset(cpumask, 0, cpumasksize);
  r = uv_thread_getaffinity(&threads[0], cpumask, cpumasksize);
  ASSERT_OK(r);
  for (i = 0; i < cpumasksize; i++) {
    if (i == c)
      ASSERT_EQ(1, cpumask[i]);
    else
      ASSERT_OK(cpumask[i]);
  }

  free(cpumask);

  return 0;
}